

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

ParsedInt anon_unknown.dwarf_dcedf7::readInt(QStringView text)

{
  QLatin1 *this;
  storage_type_conflict *in_RCX;
  char *out;
  size_t allocSize;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar1;
  ParsedInt PVar2;
  QStringView in;
  char *local_140;
  QLatin1 local_128 [256];
  long local_28;
  
  out = (char *)text.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (out == (char *)0x0) {
    QVar1 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
  }
  else {
    memset(local_128,0xaa,0x100);
    local_140 = (char *)0x100;
    this = local_128;
    if (0x100 < (long)out) {
      local_140 = (char *)QtPrivate::expectedAllocSize((size_t)out,0x10);
      if (local_140 == (char *)0x0) {
        local_140 = out;
      }
      this = (QLatin1 *)malloc((size_t)local_140);
      if (this == (QLatin1 *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          qBadAlloc();
        }
        goto LAB_00346c57;
      }
    }
    in.m_data = in_RCX;
    in.m_size = (qsizetype)text.m_data;
    QLatin1::convertFromUnicode(this,out,in);
    if ((out == (char *)0x0) || (9 < (int)(char)*this - 0x30U)) {
      QVar1 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
    }
    else {
      QVar1 = qstrntoull((char *)this,(qsizetype)out,10);
      if ((char *)QVar1.used != out) {
        QVar1 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
      }
    }
    if (this != local_128) {
      QtPrivate::sizedFree(this,(size_t)local_140);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    PVar2.result = QVar1.result;
    PVar2.used = QVar1.used;
    return PVar2;
  }
LAB_00346c57:
  __stack_chk_fail();
}

Assistant:

ParsedInt readInt(QStringView text)
{
    if (text.isEmpty())
        return {};

    // Converting to Latin-1 because QStringView::toULongLong() works with
    // US-ASCII only by design anyway.
    // Also QStringView::toULongLong() can't be used here as it will happily ignore
    // spaces and accept signs; but various date formats' fields (e.g. all in ISO)
    // should not.
    QVarLengthArray<char> latin1(text.size());
    QLatin1::convertFromUnicode(latin1.data(), text);
    return readInt(QLatin1StringView{latin1.data(), latin1.size()});
}